

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O1

void __thiscall
crnlib::crn_comp::optimize_alpha_endpoints_task(crn_comp *this,uint64 data,void *pData_ptr)

{
  long lVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  ushort uVar5;
  level_details *plVar6;
  endpoint_indices_details *peVar7;
  void *p;
  ushort uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  byte bVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  byte bVar17;
  long lVar18;
  ulong uVar19;
  uint16 i;
  ushort *puVar20;
  uint uVar21;
  uint min_new_capacity;
  ulong uVar22;
  ulong uVar23;
  vector<unsigned_short> *pvVar24;
  uint uVar25;
  ulong uVar26;
  int iVar27;
  crn_comp *this_00;
  vector<unsigned_int> hist;
  static_huffman_data_model dm;
  symbol_codec codec;
  elemental_vector local_188;
  vector<unsigned_short> *local_178;
  ulong local_170;
  crn_comp *local_168;
  ulong local_160;
  void *local_158;
  undefined8 uStack_150;
  uchar *local_140;
  uint local_138;
  void *local_120;
  long local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  long local_f0;
  symbol_codec local_e8;
  unsigned_short *local_48;
  ushort *local_40;
  long local_38;
  
  pvVar24 = *(vector<unsigned_short> **)((long)pData_ptr + 0x18);
  uVar5 = *(ushort *)((long)pData_ptr + 0x10);
  uVar22 = (ulong)uVar5;
  uVar9 = pvVar24->m_size;
  uVar25 = (uint)uVar5;
  uVar21 = (uint)uVar5;
  uVar15 = (uint)uVar5;
  local_178 = pvVar24;
  local_168 = this;
  if (uVar9 != uVar5) {
    if (uVar9 <= uVar5) {
      if (pvVar24->m_capacity < uVar21) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)pvVar24,uVar15,uVar9 + 1 == uVar21,2,(object_mover)0x0,false)
        ;
      }
      memset(pvVar24->m_p + pvVar24->m_size,0,(ulong)(uVar15 - pvVar24->m_size) * 2);
    }
    local_178->m_size = uVar25;
  }
  pvVar24 = local_178;
  local_170 = uVar22;
  local_120 = pData_ptr;
  if (data == 0) {
    lVar1 = *pData_ptr;
    uVar9 = local_178->m_size;
    if (uVar9 != uVar21) {
      if (uVar9 < uVar25 || uVar9 == uVar21) {
        if (local_178->m_capacity < uVar21) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)local_178,uVar21,uVar9 + 1 == uVar21,2,(object_mover)0x0,
                     false);
        }
        memset(pvVar24->m_p + pvVar24->m_size,0,(ulong)(uVar25 - pvVar24->m_size) * 2);
      }
      pvVar24->m_size = uVar25;
    }
    local_e8.m_pDecode_buf = (uint8 *)0x0;
    local_e8.m_pDecode_buf_next = (uint8 *)0x0;
    if (uVar22 == 0) {
      local_158 = (void *)0x0;
      uStack_150 = (unsigned_short *)0x0;
    }
    else {
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_e8,uVar21,uVar21 == 1,2,(object_mover)0x0,false);
      local_e8.m_pDecode_buf_next = (uint8 *)CONCAT44(local_e8.m_pDecode_buf_next._4_4_,uVar15);
      local_158 = (void *)0x0;
      uStack_150 = (unsigned_short *)0x0;
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_158,uVar15,uVar21 == 1,2,(object_mover)0x0,false);
      memset((void *)(((ulong)uStack_150 & 0xffffffff) * 2 + (long)local_158),0,
             (ulong)(uVar15 - (uint)uStack_150) * 2);
      uStack_150 = (unsigned_short *)CONCAT44(uStack_150._4_4_,uVar15);
      uVar11 = 0;
      do {
        *(ushort *)((long)local_e8.m_pDecode_buf + uVar11 * 2) = *(ushort *)(lVar1 + uVar11 * 2);
        *(short *)((long)local_158 + uVar11 * 2) = (short)uVar11;
        uVar11 = uVar11 + 1;
      } while (uVar22 != uVar11);
      bVar12 = 0;
      bVar17 = 0;
      uVar11 = uVar22;
      do {
        uVar9 = 0xffffffff;
        uVar19 = 0;
        uVar15 = 0;
        do {
          iVar14 = (uint)(byte)*(ushort *)((long)local_e8.m_pDecode_buf + uVar19 * 2) - (uint)bVar12
          ;
          iVar27 = (uint)*(byte *)((long)local_e8.m_pDecode_buf + uVar19 * 2 + 1) - (uint)bVar17;
          uVar21 = iVar27 * iVar27 + iVar14 * iVar14;
          if (uVar21 < uVar9) {
            uVar9 = uVar21;
            uVar15 = (uint)uVar19;
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 < uVar11);
        uVar19 = (ulong)((uVar15 & 0xffff) * 2);
        bVar12 = *(byte *)((long)local_e8.m_pDecode_buf + uVar19);
        bVar17 = *(byte *)((long)local_e8.m_pDecode_buf + uVar19 + 1);
        local_178->m_p[*(ushort *)((long)local_158 + uVar19)] = uVar5 - (short)uVar11;
        *(ushort *)((long)local_e8.m_pDecode_buf + uVar19) =
             *(ushort *)((long)local_e8.m_pDecode_buf + (uVar11 - 1) * 2);
        *(undefined2 *)((long)local_158 + uVar19) =
             *(undefined2 *)((long)local_158 + uVar11 * 2 + -2);
        uVar11 = uVar11 - 1;
        pvVar24 = local_178;
      } while (uVar11 != 0);
    }
    this_00 = local_168;
    if (local_158 != (void *)0x0) {
      crnlib_free(local_158);
    }
    if ((ushort *)local_e8.m_pDecode_buf != (ushort *)0x0) {
      crnlib_free(local_e8.m_pDecode_buf);
    }
    optimize_alpha_selectors(this_00);
  }
  else {
    local_48 = local_178->m_p;
    local_f0 = *pData_ptr;
    local_118 = *(long *)((long)pData_ptr + 8);
    uVar5 = *(ushort *)((long)pData_ptr + 0x12);
    local_160 = CONCAT44(local_160._4_4_,*(undefined4 *)((long)pData_ptr + 0x14));
    local_e8.m_pDecode_buf = (uint8 *)0x0;
    local_e8.m_pDecode_buf_next = (uint8 *)0x0;
    local_158 = (void *)0x0;
    uStack_150 = (unsigned_short *)0x0;
    local_188.m_p = (void *)0x0;
    local_188.m_size = 0;
    local_188.m_capacity = 0;
    if (uVar21 != 0) {
      elemental_vector::increase_capacity(&local_188,uVar15,uVar15 == 1,4,(object_mover)0x0,false);
      memset((void *)((local_188._8_8_ & 0xffffffff) * 4 + (long)local_188.m_p),0,
             (ulong)(uVar15 - local_188.m_size) << 2);
      local_188.m_size = uVar21;
    }
    if (local_e8.m_pDecode_buf_next._4_4_ <= (uint)local_e8.m_pDecode_buf_next) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_e8,(uint)local_e8.m_pDecode_buf_next + 1,true,2,
                 (object_mover)0x0,false);
    }
    *(ushort *)
     ((long)local_e8.m_pDecode_buf + ((ulong)local_e8.m_pDecode_buf_next & 0xffffffff) * 2) = uVar5;
    local_e8.m_pDecode_buf_next =
         (uint8 *)CONCAT44(local_e8.m_pDecode_buf_next._4_4_,(uint)local_e8.m_pDecode_buf_next + 1);
    if (uVar22 != 0) {
      lVar1 = local_118 + (ulong)(uVar5 * (uint)local_170) * 4;
      uVar22 = 0;
      do {
        if (uVar5 != uVar22) {
          if (uStack_150._4_4_ <= (uint)uStack_150) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&local_158,(uint)uStack_150 + 1,true,2,(object_mover)0x0,
                       false);
          }
          *(short *)((long)local_158 + ((ulong)uStack_150 & 0xffffffff) * 2) = (short)uVar22;
          uStack_150 = (unsigned_short *)CONCAT44(uStack_150._4_4_,(uint)uStack_150 + 1);
          *(undefined4 *)((long)local_188.m_p + uVar22 * 4) = *(undefined4 *)(lVar1 + uVar22 * 4);
        }
        uVar22 = uVar22 + 1;
      } while (local_170 != uVar22);
    }
    if ((uint)uStack_150 != 0) {
      local_38 = (long)(((float)local_160 + 1.0) * 1000.0);
      local_160 = 0;
      do {
        uVar22 = (ulong)local_e8.m_pDecode_buf_next & 0xffffffff;
        uVar13 = (ulong)((uint)local_e8.m_pDecode_buf_next - 1);
        local_40 = (ushort *)local_e8.m_pDecode_buf;
        local_f8 = 0;
        uVar11 = 0;
        uVar19 = 0;
        local_100 = 0;
        local_108 = 0;
        do {
          uVar26 = (ulong)*(ushort *)((long)local_158 + (uVar19 & 0xffff) * 2);
          uVar21 = (uint)*(byte *)(local_f0 + uVar26 * 2);
          iVar27 = uVar21 - *(byte *)(local_f0 + (ulong)*(ushort *)local_e8.m_pDecode_buf * 2);
          uVar9 = (uint)*(byte *)(local_f0 + 1 + uVar26 * 2);
          iVar14 = uVar9 - *(byte *)(local_f0 + 1 + (ulong)*(ushort *)local_e8.m_pDecode_buf * 2);
          uVar15 = iVar14 * iVar14 + iVar27 * iVar27;
          if (999 < uVar15) {
            uVar15 = 1000;
          }
          iVar27 = uVar21 - *(byte *)(local_f0 +
                                     (ulong)*(ushort *)((long)local_e8.m_pDecode_buf + uVar13 * 2) *
                                     2);
          iVar14 = uVar9 - *(byte *)(local_f0 + 1 +
                                    (ulong)*(ushort *)((long)local_e8.m_pDecode_buf + uVar13 * 2) *
                                    2);
          uVar9 = iVar14 * iVar14 + iVar27 * iVar27;
          if (999 < uVar9) {
            uVar9 = 1000;
          }
          uVar23 = (ulong)((int)local_38 - uVar15);
          uVar16 = (ulong)((int)local_38 - uVar9);
          uVar10 = uVar16;
          if (uVar16 < uVar23) {
            uVar10 = uVar23;
          }
          uVar10 = (uint)(*(int *)((long)local_188.m_p + uVar26 * 4) + (int)(float)local_160) *
                   uVar10;
          if (uVar11 <= uVar10) {
            uVar11 = uVar10 + 1;
            local_108 = uVar23;
            local_100 = uVar16;
            local_f8 = uVar19;
          }
          uVar9 = (int)uVar19 + 1;
          uVar19 = (ulong)uVar9;
        } while ((uVar9 & 0xffff) < (uint)uStack_150);
        uVar8 = (ushort)local_f8;
        uVar11 = local_f8 & 0xffff;
        uVar5 = *(ushort *)((long)local_158 + uVar11 * 2);
        lVar1 = local_118 + (ulong)(uVar5 * (uint)local_170) * 4;
        if ((int)((uint)local_e8.m_pDecode_buf_next - 1) < 1) {
          uVar19 = 0;
          uVar13 = 0;
        }
        else {
          iVar14 = (uint)local_e8.m_pDecode_buf_next + 1;
          uVar9 = 0;
          uVar19 = 0;
          puVar20 = (ushort *)local_e8.m_pDecode_buf;
          do {
            iVar14 = iVar14 + -2;
            uVar19 = (ulong)(uint)((int)uVar19 + *(int *)(lVar1 + (ulong)*puVar20 * 4) * iVar14);
            uVar9 = uVar9 + *(int *)(lVar1 + (ulong)*(ushort *)
                                                     ((long)local_e8.m_pDecode_buf + uVar13 * 2) * 4
                                    ) * iVar14;
            uVar13 = (ulong)((int)uVar13 - 1);
            puVar20 = puVar20 + 1;
          } while (2 < iVar14);
          uVar13 = (ulong)uVar9;
        }
        local_160 = (ulong)*(uint *)((long)local_188.m_p + (ulong)uVar5 * 4);
        local_110 = uVar22;
        if (uVar19 * local_108 < uVar13 * local_100 || uVar19 * local_108 - uVar13 * local_100 == 0)
        {
          if (local_e8.m_pDecode_buf_next._4_4_ <= (uint)local_e8.m_pDecode_buf_next) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&local_e8,(uint)local_e8.m_pDecode_buf_next + 1,true,2,
                       (object_mover)0x0,false);
          }
          *(ushort *)
           ((long)local_e8.m_pDecode_buf + ((ulong)local_e8.m_pDecode_buf_next & 0xffffffff) * 2) =
               uVar5;
          local_e8.m_pDecode_buf_next =
               (uint8 *)CONCAT44(local_e8.m_pDecode_buf_next._4_4_,
                                 (uint)local_e8.m_pDecode_buf_next + 1);
        }
        else {
          uVar9 = (uint)local_e8.m_pDecode_buf_next + 1;
          if (uVar22 != 0xffffffff) {
            if (local_e8.m_pDecode_buf_next._4_4_ < uVar9) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)&local_e8,uVar9,true,2,(object_mover)0x0,false);
            }
            memset((ushort *)
                   ((long)local_e8.m_pDecode_buf +
                   ((ulong)local_e8.m_pDecode_buf_next & 0xffffffff) * 2),0,
                   (ulong)(uVar9 - (uint)local_e8.m_pDecode_buf_next) * 2);
          }
          local_e8.m_pDecode_buf_next = (uint8 *)CONCAT44(local_e8.m_pDecode_buf_next._4_4_,uVar9);
          memmove((ushort *)((long)local_e8.m_pDecode_buf + 2),local_e8.m_pDecode_buf,uVar22 * 2);
          *(ushort *)local_e8.m_pDecode_buf = uVar5;
        }
        if (uVar8 < (uint)uStack_150) {
          memmove((void *)((long)local_158 + uVar11 * 2),(void *)((long)local_158 + uVar11 * 2 + 2),
                  (ulong)((uint)uStack_150 + ~(uint)uVar8) * 2);
          uStack_150 = (unsigned_short *)CONCAT44(uStack_150._4_4_,(uint)uStack_150 - 1);
        }
        if ((uint)uStack_150 != 0) {
          uVar9 = 1;
          do {
            lVar18 = (ulong)*(ushort *)((long)local_158 + (ulong)(uVar9 - 1 & 0xffff) * 2) * 4;
            piVar2 = (int *)((long)local_188.m_p + lVar18);
            *piVar2 = *piVar2 + *(int *)(lVar1 + lVar18);
            uVar15 = uVar9 & 0xffff;
            uVar9 = uVar9 + 1;
          } while (uVar15 < (uint)uStack_150);
        }
      } while ((uint)uStack_150 != 0);
    }
    pData_ptr = local_120;
    this_00 = local_168;
    uVar22 = local_170;
    pvVar24 = local_178;
    if (local_170 != 0) {
      uVar11 = 0;
      do {
        local_48[*(ushort *)((long)local_e8.m_pDecode_buf + uVar11 * 2)] = (unsigned_short)uVar11;
        uVar11 = uVar11 + 1;
      } while (local_170 != uVar11);
    }
    if (local_188.m_p != (void *)0x0) {
      crnlib_free(local_188.m_p);
    }
    if (local_158 != (void *)0x0) {
      crnlib_free(local_158);
    }
    if ((ushort *)local_e8.m_pDecode_buf != (ushort *)0x0) {
      crnlib_free(local_e8.m_pDecode_buf);
    }
  }
  pack_alpha_endpoints
            (this_00,(vector<unsigned_char> *)(*(long *)((long)pData_ptr + 0x18) + 0x10),pvVar24);
  iVar14 = *(int *)(*(long *)((long)pData_ptr + 0x18) + 0x18);
  local_188.m_p = (void *)0x0;
  local_188.m_size = 0;
  local_188.m_capacity = 0;
  if (uVar22 != 0) {
    min_new_capacity = (uint)uVar22;
    elemental_vector::increase_capacity
              (&local_188,min_new_capacity,min_new_capacity == 1,4,(object_mover)0x0,false);
    memset((void *)((local_188._8_8_ & 0xffffffff) * 4 + (long)local_188.m_p),0,
           (ulong)(min_new_capacity - local_188.m_size) << 2);
    local_188.m_size = min_new_capacity;
    pvVar24 = local_178;
  }
  if ((this_00->m_levels).m_size != 0) {
    bVar3 = this_00->m_has_comp[1];
    bVar4 = this_00->m_has_comp[2];
    plVar6 = (this_00->m_levels).m_p;
    uVar11 = 0;
    do {
      uVar9 = plVar6[uVar11].first_block;
      uVar19 = (ulong)uVar9;
      uVar15 = plVar6[uVar11].num_blocks + uVar9;
      if (uVar9 < uVar15) {
        peVar7 = (local_168->m_endpoint_indices).m_p;
        uVar21 = 0;
        uVar9 = 0;
        do {
          uVar25 = uVar21;
          if ((bVar3 != false) &&
             (uVar25 = (uint)pvVar24->m_p[peVar7[uVar19].field_0.field_0.alpha0],
             peVar7[uVar19].reference == '\0')) {
            piVar2 = (int *)((long)local_188.m_p +
                            (ulong)(((int)(uVar25 - uVar21) >> 0x1f & (uint)uVar22) +
                                   (uVar25 - uVar21)) * 4);
            *piVar2 = *piVar2 + 1;
          }
          uVar21 = uVar25;
          uVar25 = uVar9;
          if (bVar4 != false) {
            uVar5 = pvVar24->m_p[peVar7[uVar19].field_0.field_0.alpha1];
            uVar25 = (uint)uVar5;
            if (peVar7[uVar19].reference == '\0') {
              piVar2 = (int *)((long)local_188.m_p +
                              (ulong)(((int)(uVar5 - uVar9) >> 0x1f & (uint)local_170) +
                                     (uVar5 - uVar9)) * 4);
              *piVar2 = *piVar2 + 1;
              uVar22 = local_170;
            }
          }
          uVar9 = uVar25;
          uVar19 = uVar19 + 1;
        } while (uVar15 != uVar19);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (local_168->m_levels).m_size);
  }
  static_huffman_data_model::static_huffman_data_model((static_huffman_data_model *)&local_158);
  static_huffman_data_model::init((static_huffman_data_model *)&local_158,(EVP_PKEY_CTX *)0x1);
  p = local_120;
  if (local_138 == 0) {
    local_140 = (uchar *)0x0;
  }
  iVar14 = iVar14 << 3;
  if (uVar22 != 0) {
    uVar11 = 0;
    do {
      iVar14 = iVar14 + (uint)local_140[uVar11] * *(int *)((long)local_188.m_p + uVar11 * 4);
      uVar11 = uVar11 + 1;
    } while ((uVar22 & 0xffffffff) != uVar11);
  }
  symbol_codec::symbol_codec(&local_e8);
  symbol_codec::start_encoding(&local_e8,0x10000);
  local_e8.m_simulate_encoding = true;
  symbol_codec::encode_transmit_static_huffman_data_model
            (&local_e8,(static_huffman_data_model *)&local_158,false,
             (static_huffman_data_model *)0x0);
  symbol_codec::stop_encoding(&local_e8,false);
  *(uint *)(*(long *)((long)p + 0x18) + 0x20) = iVar14 + local_e8.m_total_bits_written;
  if (p != (void *)0x0) {
    crnlib_free(p);
  }
  if (local_e8.m_output_syms.m_p != (output_symbol *)0x0) {
    crnlib_free(local_e8.m_output_syms.m_p);
  }
  if (local_e8.m_arith_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_e8.m_arith_output_buf.m_p);
  }
  if (local_e8.m_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_e8.m_output_buf.m_p);
  }
  static_huffman_data_model::~static_huffman_data_model((static_huffman_data_model *)&local_158);
  if (local_188.m_p != (void *)0x0) {
    crnlib_free(local_188.m_p);
  }
  return;
}

Assistant:

void crn_comp::optimize_alpha_endpoints_task(uint64 data, void* pData_ptr)
    {
        optimize_alpha_params* pParams = reinterpret_cast<optimize_alpha_params*>(pData_ptr);
        crnlib::vector<uint16>& remapping = pParams->pResult->endpoint_remapping;
        uint16 n = pParams->n;
        remapping.resize(n);

        if (data)
        {
            remap_alpha_endpoints(remapping.get_ptr(), pParams->unpacked_endpoints, pParams->hist, n, pParams->selected, pParams->weight);
        }
        else
        {
            sort_alpha_endpoints(remapping, pParams->unpacked_endpoints, n);
            optimize_alpha_selectors();
        }

        pack_alpha_endpoints(pParams->pResult->packed_endpoints, remapping);
        uint total_bits = pParams->pResult->packed_endpoints.size() << 3;

        crnlib::vector<uint> hist(n);
        bool hasAlpha0 = m_has_comp[cAlpha0], hasAlpha1 = m_has_comp[cAlpha1];
        for (uint level = 0; level < m_levels.size(); level++)
        {
            for (uint alpha0_index = 0, alpha1_index = 0, b = m_levels[level].first_block, bEnd = b + m_levels[level].num_blocks; b < bEnd; b++)
            {
                if (hasAlpha0)
                {
                    uint index = remapping[m_endpoint_indices[b].component[cAlpha0]];
                    if (!m_endpoint_indices[b].reference)
                    {
                        int sym = index - alpha0_index;
                        hist[sym < 0 ? sym + n : sym]++;
                    }
                    alpha0_index = index;
                }
                if (hasAlpha1)
                {
                    uint index = remapping[m_endpoint_indices[b].component[cAlpha1]];
                    if (!m_endpoint_indices[b].reference)
                    {
                        int sym = index - alpha1_index;
                        hist[sym < 0 ? sym + n : sym]++;
                    }
                    alpha1_index = index;
                }
            }
        }

        static_huffman_data_model dm;
        dm.init(true, n, hist.get_ptr(), 16);
        const uint8* code_sizes = dm.get_code_sizes();
        for (uint16 s = 0; s < n; s++)
        {
            total_bits += hist[s] * code_sizes[s];
        }

        symbol_codec codec;
        codec.start_encoding(64 * 1024);
        codec.encode_enable_simulation(true);
        codec.encode_transmit_static_huffman_data_model(dm, false);
        codec.stop_encoding(false);
        total_bits += codec.encode_get_total_bits_written();

        pParams->pResult->total_bits = total_bits;

        crnlib_delete(pParams);
    }